

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesNH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  size_t sVar4;
  HasherCommon *pHVar5;
  Command *pCVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  long lVar15;
  uint32_t *puVar16;
  uint16_t *puVar17;
  uint8_t *puVar18;
  BankH42 *pBVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint8_t *puVar24;
  uint8_t *puVar25;
  undefined8 uVar26;
  void *pvVar27;
  size_t sVar28;
  uint8_t *puVar29;
  long lVar30;
  byte bVar31;
  uint32_t uVar32;
  size_t sVar33;
  int *piVar34;
  uint8_t *puVar35;
  BrotliEncoderDictionary *pBVar36;
  bool bVar37;
  uint8_t *local_1158;
  uint8_t *local_1148;
  uint8_t *local_1138;
  uint8_t *local_1130;
  uint8_t *local_1120;
  uint8_t *local_1108;
  uint8_t *local_10f8;
  uint8_t *local_10f0;
  ulong local_10e8;
  ulong local_10e0;
  uint8_t *local_10d0;
  uint8_t *local_10c8;
  uint8_t *local_10c0;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  size_t sStack_1050;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H42 *privat;
  BrotliEncoderParams *params_local;
  ContextLut literal_context_lut_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_eb8;
  uint32_t delta_4;
  size_t nbits;
  size_t offset_4;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_da2;
  uint32_t nbits_2;
  ushort local_d7a;
  uint32_t offset_5;
  uint16_t bits64;
  ushort local_d52;
  int next_last_distance_1;
  int last_distance_1;
  int next_last_distance;
  int last_distance;
  int is_ok_1;
  size_t score_7;
  size_t len_5;
  size_t last_1;
  size_t prev_ix_5;
  size_t slot_1;
  size_t delta_2;
  size_t hops_1;
  size_t backward_6;
  size_t bank_2;
  size_t score_6;
  size_t len_4;
  size_t prev_ix_4;
  size_t backward_5;
  uint8_t tiny_hash_2;
  size_t key_3;
  size_t i_2;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t cur_ix_masked_1;
  BankH42 *banks_2;
  uint8_t *tiny_hashes_1;
  uint16_t *head_2;
  uint32_t *addr_2;
  size_t matching_bits_6;
  uint64_t x_6;
  size_t limit2_6;
  size_t matched_6;
  ulong *local_ba0;
  size_t local_b90;
  size_t matching_bits_5;
  uint64_t x_5;
  size_t limit2_5;
  size_t matched_5;
  ulong *local_b60;
  size_t local_b50;
  ulong uStack_b28;
  int item_matches_1;
  size_t i_3;
  size_t key_5;
  uint32_t h_5;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_8;
  size_t backward_7;
  size_t matchlen_2;
  size_t offset_2;
  size_t matching_bits_7;
  uint64_t x_7;
  size_t limit2_7;
  size_t matched_7;
  ulong *local_9e0;
  size_t local_9d0;
  size_t score_5;
  size_t len_3;
  size_t prev_ix_3;
  size_t backward_4;
  size_t matching_bits_4;
  uint64_t x_4;
  size_t limit2_4;
  size_t matched_4;
  ulong *local_8f8;
  size_t local_8e8;
  size_t score_9;
  size_t matchlen_3;
  uint8_t *string_1;
  BrotliTransforms *transforms_1;
  uint8_t *word_1;
  int transform_idx_1;
  int word_idx_1;
  int mask_1;
  uint32_t shift_1;
  size_t offset_3;
  BrotliDictionary *words_1;
  int address_1;
  int is_ok;
  size_t score_2;
  size_t len_2;
  size_t last;
  size_t prev_ix_2;
  size_t slot;
  size_t delta;
  size_t hops;
  size_t backward_2;
  size_t bank;
  size_t score_1;
  size_t len_1;
  size_t prev_ix_1;
  size_t backward_1;
  uint8_t tiny_hash;
  size_t key;
  size_t i;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t cur_ix_masked;
  BankH42 *banks;
  uint8_t *tiny_hashes;
  uint16_t *head;
  uint32_t *addr;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_690;
  size_t local_680;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_650;
  size_t local_640;
  ulong uStack_618;
  int item_matches;
  size_t i_1;
  size_t key_2;
  uint32_t h_2;
  size_t transform_id;
  size_t cut;
  size_t score_3;
  size_t backward_3;
  size_t matchlen;
  size_t offset;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_4d0;
  size_t local_4c0;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t backward;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_3e8;
  size_t local_3d8;
  size_t score_4;
  size_t matchlen_1;
  uint8_t *string;
  BrotliTransforms *transforms;
  uint8_t *word;
  int transform_idx;
  int word_idx;
  int mask;
  uint32_t shift;
  size_t offset_1;
  BrotliDictionary *words;
  int address;
  uint8_t *local_2e0;
  size_t i_4;
  ulong local_2b0;
  size_t delta_5;
  size_t idx_2;
  size_t bank_4;
  size_t key_6;
  BankH42 *banks_4;
  uint8_t *tiny_hash_4;
  uint16_t *head_4;
  uint32_t *addr_4;
  ulong local_250;
  size_t delta_1;
  size_t idx;
  size_t bank_1;
  size_t key_1;
  BankH42 *banks_1;
  uint8_t *tiny_hash_1;
  uint16_t *head_1;
  uint32_t *addr_1;
  ulong local_1f0;
  size_t delta_3;
  size_t idx_1;
  size_t bank_3;
  size_t key_4;
  BankH42 *banks_3;
  uint8_t *tiny_hash_3;
  uint16_t *head_3;
  uint32_t *addr_3;
  ulong local_190;
  size_t delta_7;
  size_t idx_4;
  size_t bank_6;
  size_t key_8;
  BankH42 *banks_6;
  uint8_t *tiny_hash_6;
  uint16_t *head_6;
  uint32_t *addr_6;
  ulong local_130;
  size_t delta_6;
  size_t idx_3;
  size_t bank_5;
  size_t key_7;
  BankH42 *banks_5;
  uint8_t *tiny_hash_5;
  uint16_t *head_5;
  uint32_t *addr_5;
  uint32_t h_7;
  uint32_t h_8;
  uint32_t h_4;
  uint32_t h_1;
  uint32_t h_6;
  uint32_t h;
  uint32_t h_3;
  
  pCVar6 = commands;
  puVar13 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  sVar4 = params->stream_offset;
  pos_end = *last_insert_len;
  puVar14 = (uint8_t *)(position + num_bytes);
  local_10c0 = (uint8_t *)position;
  if (3 < num_bytes) {
    local_10c0 = (uint8_t *)((position + num_bytes) - 3);
  }
  iVar11 = 0x200;
  if (params->quality < 9) {
    iVar11 = 0x40;
  }
  lVar15 = (long)iVar11;
  gap = position + lVar15;
  iVar11 = *dist_cache;
  dist_cache[4] = iVar11 + -1;
  dist_cache[5] = iVar11 + 1;
  dist_cache[6] = iVar11 + -2;
  dist_cache[7] = iVar11 + 2;
  dist_cache[8] = iVar11 + -3;
  dist_cache[9] = iVar11 + 3;
  iVar11 = dist_cache[1];
  dist_cache[10] = iVar11 + -1;
  dist_cache[0xb] = iVar11 + 1;
  dist_cache[0xc] = iVar11 + -2;
  dist_cache[0xd] = iVar11 + 2;
  dist_cache[0xe] = iVar11 + -3;
  dist_cache[0xf] = iVar11 + 3;
  puVar29 = (uint8_t *)position;
LAB_0011e441:
  do {
    ringbuffer_local = puVar29;
    if (puVar14 <= ringbuffer_local + 4) {
      *last_insert_len = (size_t)(puVar14 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar6 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar14 - (long)ringbuffer_local;
    local_10c8 = puVar13;
    if (ringbuffer_local < puVar13) {
      local_10c8 = ringbuffer_local;
    }
    local_10d0 = puVar13;
    if (ringbuffer_local + sVar4 < puVar13) {
      local_10d0 = ringbuffer_local + sVar4;
    }
    sr.len = 0;
    sr.distance = 0x7e4;
    sr.score = 0;
    pBVar36 = &params->dictionary;
    puVar29 = (uint8_t *)(params->dist).max_distance;
    puVar16 = AddrH42((hasher->privat)._H42.extra);
    puVar17 = HeadH42((hasher->privat)._H42.extra);
    puVar18 = TinyHashH42((hasher->privat)._H42.extra);
    pBVar19 = BanksH42((hasher->privat)._H42.extra);
    uVar20 = (ulong)ringbuffer_local & ringbuffer_mask;
    best_len = 0x7e4;
    i = 0;
    uVar7 = (uint)(*(int *)(ringbuffer + uVar20) * 0x1e35a7bd) >> 0x11;
    uVar21 = (ulong)uVar7;
    sStack_1050 = 0;
    sr.score._0_4_ = 0;
    while( true ) {
      bVar37 = false;
      if (*back_refs_position < back_refs_size) {
        bVar37 = (uint8_t *)(long)backward_references[*back_refs_position].position <
                 ringbuffer_local;
      }
      if (!bVar37) break;
      *back_refs_position = *back_refs_position + 1;
    }
    if (((back_refs_size == 0) || (back_refs_size <= *back_refs_position)) ||
       ((uint8_t *)(long)backward_references[*back_refs_position].position != ringbuffer_local)) {
      for (key = 0; key < 0x10; key = key + 1) {
        puVar35 = (uint8_t *)(long)dist_cache[key];
        puVar24 = ringbuffer_local + -(long)puVar35;
        if (((key == 0) || (puVar18[(ulong)puVar24 & 0xffff] == (uint8_t)uVar7)) &&
           ((puVar24 < ringbuffer_local && (puVar35 <= local_10c8)))) {
          uVar22 = ringbuffer_mask & (ulong)puVar24;
          local_650 = (ulong *)(ringbuffer + uVar20);
          limit2_1 = 0;
          x_1 = (max_distance >> 3) + 1;
LAB_0011ecfe:
          x_1 = x_1 - 1;
          if (x_1 != 0) {
            if (*local_650 == *(ulong *)(ringbuffer + limit2_1 + uVar22)) goto LAB_0011ed60;
            iVar11 = 0;
            for (uVar22 = *local_650 ^ *(ulong *)(ringbuffer + limit2_1 + uVar22); (uVar22 & 1) == 0
                ; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              iVar11 = iVar11 + 1;
            }
            local_640 = ((ulong)(long)iVar11 >> 3) + limit2_1;
            goto LAB_0011eea1;
          }
          matched_1 = (max_distance & 7) + 1;
          while (matched_1 = matched_1 - 1, matched_1 != 0) {
            if (ringbuffer[limit2_1 + uVar22] != (uint8_t)*local_650) {
              local_640 = limit2_1;
              goto LAB_0011eea1;
            }
            local_650 = (ulong *)((long)local_650 + 1);
            limit2_1 = limit2_1 + 1;
          }
          local_640 = limit2_1;
LAB_0011eea1:
          score_1 = local_640;
          if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
             ((uint8_t *)(long)backward_references[*back_refs_position].position <
              ringbuffer_local + local_640)) {
            score_1 = (long)backward_references[*back_refs_position].position -
                      (long)ringbuffer_local;
          }
          if ((1 < score_1) && (bank = score_1 * 0x87 + 0x78f, best_len < bank)) {
            if (key != 0) {
              bank = bank - ((long)(int)(0x1ca10 >> ((byte)key & 0xe) & 0xe) + 0x27);
            }
            if (best_len < bank) {
              best_len = bank;
              i = score_1;
              sStack_1050 = score_1;
              sr.distance = bank;
              sr.len = (size_t)puVar35;
            }
          }
        }
      }
      hops = 0;
      slot = (long)ringbuffer_local - (ulong)puVar16[uVar21];
      prev_ix_2 = (ulong)puVar17[uVar21];
      delta = (hasher->privat)._H42.max_hops;
      while ((sVar33 = delta - 1, delta != 0 && (hops = slot + hops, hops <= local_10c8))) {
        uVar22 = (long)ringbuffer_local - hops & ringbuffer_mask;
        uVar23 = (ulong)pBVar19[uVar21 & 0x1ff].slots[prev_ix_2].next;
        slot = (size_t)pBVar19[uVar21 & 0x1ff].slots[prev_ix_2].delta;
        prev_ix_2 = uVar23;
        delta = sVar33;
        if ((uVar20 + i <= ringbuffer_mask) &&
           ((uVar22 + i <= ringbuffer_mask && (ringbuffer[uVar20 + i] == ringbuffer[uVar22 + i]))))
        {
          local_690 = (ulong *)(ringbuffer + uVar20);
          limit2_2 = 0;
          x_2 = (max_distance >> 3) + 1;
LAB_0011f227:
          x_2 = x_2 - 1;
          if (x_2 != 0) {
            if (*local_690 == *(ulong *)(ringbuffer + limit2_2 + uVar22)) goto LAB_0011f289;
            iVar11 = 0;
            for (uVar22 = *local_690 ^ *(ulong *)(ringbuffer + limit2_2 + uVar22); (uVar22 & 1) == 0
                ; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              iVar11 = iVar11 + 1;
            }
            local_680 = ((ulong)(long)iVar11 >> 3) + limit2_2;
            goto LAB_0011f3ca;
          }
          matched_2 = (max_distance & 7) + 1;
          while (matched_2 = matched_2 - 1, matched_2 != 0) {
            if (ringbuffer[limit2_2 + uVar22] != (uint8_t)*local_690) {
              local_680 = limit2_2;
              goto LAB_0011f3ca;
            }
            local_690 = (ulong *)((long)local_690 + 1);
            limit2_2 = limit2_2 + 1;
          }
          local_680 = limit2_2;
LAB_0011f3ca:
          score_2 = local_680;
          if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
             ((uint8_t *)(long)backward_references[*back_refs_position].position <
              ringbuffer_local + local_680)) {
            score_2 = (long)backward_references[*back_refs_position].position -
                      (long)ringbuffer_local;
          }
          if (3 < score_2) {
            iVar11 = 0x1f;
            if ((uint)hops != 0) {
              for (; (uint)hops >> iVar11 == 0; iVar11 = iVar11 + -1) {
              }
            }
            uVar22 = (score_2 * 0x87 + 0x780) - (ulong)(uint)(iVar11 * 0x1e);
            if (best_len < uVar22) {
              i = score_2;
              sStack_1050 = score_2;
              sr.len = hops;
              sr.distance = uVar22;
              best_len = uVar22;
            }
          }
        }
      }
      puVar16 = AddrH42((hasher->privat)._H42.extra);
      puVar17 = HeadH42((hasher->privat)._H42.extra);
      puVar18 = TinyHashH42((hasher->privat)._H42.extra);
      pBVar19 = BanksH42((hasher->privat)._H42.extra);
      uVar7 = (uint)(*(int *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask)) * 0x1e35a7bd
                    ) >> 0x11;
      uVar21 = (ulong)uVar7;
      uVar22 = uVar21 & 0x1ff;
      uVar2 = *(ushort *)((long)&hasher->privat + uVar22 * 2);
      *(ushort *)((long)&hasher->privat + uVar22 * 2) = uVar2 + 1;
      uVar12 = uVar2 & 0x1ff;
      local_250 = (long)ringbuffer_local - (ulong)puVar16[uVar21];
      puVar18[(ulong)ringbuffer_local & 0xffff] = (uint8_t)uVar7;
      if (0xffff < local_250) {
        local_250 = 0xffff;
      }
      pBVar19[uVar22].slots[(int)uVar12].delta = (uint16_t)local_250;
      pBVar19[uVar22].slots[(int)uVar12].next = puVar17[uVar21];
      puVar16[uVar21] = (uint32_t)ringbuffer_local;
      puVar17[uVar21] = (uint16_t)uVar12;
LAB_0011f728:
      if (sr.distance == 0x7e4) {
        if (back_refs_size == 0) {
          pHVar5 = (hasher->privat)._H42.common;
          piVar34 = (int *)(ringbuffer + uVar20);
          if (pHVar5->dict_num_lookups >> 7 <= pHVar5->dict_num_matches) {
            i_1 = (size_t)(((uint)(*piVar34 * 0x1e35a7bd) >> 0x12) << 1);
            for (uStack_618 = 0; uStack_618 < 2; uStack_618 = uStack_618 + 1) {
              pHVar5->dict_num_lookups = pHVar5->dict_num_lookups + 1;
              if ((params->dictionary).hash_table_lengths[i_1] != '\0') {
                bVar1 = (params->dictionary).hash_table_lengths[i_1];
                uVar21 = (ulong)bVar1;
                uVar20 = (ulong)(params->dictionary).hash_table_words[i_1];
                if (max_distance < uVar21) {
                  bVar37 = false;
                }
                else {
                  local_4d0 = (ulong *)(pBVar36->words->data +
                                       (ulong)pBVar36->words->offsets_by_length[uVar21] +
                                       uVar21 * uVar20);
                  limit2_3 = 0;
                  x_3 = (ulong)(bVar1 >> 3) + 1;
LAB_0011f9d1:
                  x_3 = x_3 - 1;
                  if (x_3 != 0) {
                    if (*local_4d0 == *(ulong *)((long)piVar34 + limit2_3)) goto LAB_0011fa33;
                    iVar11 = 0;
                    for (uVar22 = *local_4d0 ^ *(ulong *)((long)piVar34 + limit2_3);
                        (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                      iVar11 = iVar11 + 1;
                    }
                    local_4c0 = ((ulong)(long)iVar11 >> 3) + limit2_3;
                    goto LAB_0011fb74;
                  }
                  matched_3 = (uVar21 & 7) + 1;
                  while (matched_3 = matched_3 - 1, matched_3 != 0) {
                    if (*(char *)((long)piVar34 + limit2_3) != (char)*local_4d0) {
                      local_4c0 = limit2_3;
                      goto LAB_0011fb74;
                    }
                    local_4d0 = (ulong *)((long)local_4d0 + 1);
                    limit2_3 = limit2_3 + 1;
                  }
                  local_4c0 = limit2_3;
LAB_0011fb74:
                  if ((uVar21 < local_4c0 + (params->dictionary).cutoffTransformsCount) &&
                     (local_4c0 != 0)) {
                    puVar18 = local_10d0 +
                              ((uVar21 - local_4c0) * 4 +
                               ((params->dictionary).cutoffTransforms >>
                                ((char)(uVar21 - local_4c0) * '\x06' & 0x3fU) & 0x3f) <<
                              (pBVar36->words->size_bits_by_length[uVar21] & 0x3f)) + uVar20 + 1;
                    if (puVar29 < puVar18) {
                      bVar37 = false;
                    }
                    else {
                      iVar11 = 0x1f;
                      if ((uint)puVar18 != 0) {
                        for (; (uint)puVar18 >> iVar11 == 0; iVar11 = iVar11 + -1) {
                        }
                      }
                      uVar20 = (local_4c0 * 0x87 + 0x780) - (ulong)(uint)(iVar11 * 0x1e);
                      if (uVar20 < sr.distance) {
                        bVar37 = false;
                      }
                      else {
                        sStack_1050 = local_4c0;
                        sr.score._0_4_ = (uint)bVar1 - (int)local_4c0;
                        bVar37 = true;
                        sr.len = (size_t)puVar18;
                        sr.distance = uVar20;
                      }
                    }
                  }
                  else {
                    bVar37 = false;
                  }
                }
                if (bVar37) {
                  pHVar5->dict_num_matches = pHVar5->dict_num_matches + 1;
                }
              }
              i_1 = i_1 + 1;
            }
          }
        }
        else if (((*back_refs_position < back_refs_size) &&
                 ((uint8_t *)(long)backward_references[*back_refs_position].position ==
                  ringbuffer_local)) &&
                (backward_references[*back_refs_position].max_distance <
                 backward_references[*back_refs_position].distance)) {
          uVar7 = backward_references[*back_refs_position].distance;
          iVar11 = backward_references[*back_refs_position].copy_len;
          if ((((int)uVar7 < 0x7ffffffd) && (3 < iVar11)) && (iVar11 < 0x19)) {
            uVar8 = (uVar7 - (int)local_10c8) - 1;
            uVar12 = pBVar36->words->offsets_by_length[iVar11];
            bVar1 = pBVar36->words->size_bits_by_length[iVar11];
            uVar3 = kBitMask[bVar1];
            iVar9 = (int)uVar8 >> (bVar1 & 0x1f);
            if (iVar9 < (int)(params->dictionary).num_transforms) {
              puVar29 = pBVar36->words->data;
              uVar26 = BrotliGetTransforms();
              pvVar27 = malloc((long)iVar11 * 10);
              iVar9 = BrotliTransformDictionaryWord
                                (pvVar27,puVar29 + (long)(int)((uVar8 & uVar3) * iVar11) +
                                                   (ulong)uVar12,iVar11,uVar26,iVar9);
              sVar28 = (size_t)iVar9;
              iVar10 = memcmp(ringbuffer + uVar20,pvVar27,sVar28);
              if (iVar10 == 0) {
                iVar10 = 0x1f;
                if (uVar7 != 0) {
                  for (; uVar7 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                  }
                }
                sr.distance = (sVar28 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
                sr.score._0_4_ = iVar11 - iVar9;
                sr.len = (size_t)(int)uVar7;
                sStack_1050 = sVar28;
              }
            }
          }
        }
      }
    }
    else {
      uVar7 = backward_references[*back_refs_position].distance;
      uVar21 = (ulong)(int)uVar7;
      if ((ringbuffer_local + -uVar21 < ringbuffer_local) &&
         (uVar21 <= (ulong)(long)backward_references[*back_refs_position].max_distance)) {
        uVar22 = ringbuffer_mask & (ulong)(ringbuffer_local + -uVar21);
        local_3e8 = (ulong *)(ringbuffer + uVar20);
        limit2 = 0;
        x = (max_distance >> 3) + 1;
LAB_0011e945:
        x = x - 1;
        if (x != 0) {
          if (*local_3e8 == *(ulong *)(ringbuffer + limit2 + uVar22)) goto LAB_0011e9a7;
          iVar11 = 0;
          for (uVar22 = *local_3e8 ^ *(ulong *)(ringbuffer + limit2 + uVar22); (uVar22 & 1) == 0;
              uVar22 = uVar22 >> 1 | 0x8000000000000000) {
            iVar11 = iVar11 + 1;
          }
          local_3d8 = ((ulong)(long)iVar11 >> 3) + limit2;
          goto LAB_0011eae8;
        }
        matched = (max_distance & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (ringbuffer[limit2 + uVar22] != (uint8_t)*local_3e8) {
            local_3d8 = limit2;
            goto LAB_0011eae8;
          }
          local_3e8 = (ulong *)((long)local_3e8 + 1);
          limit2 = limit2 + 1;
        }
        local_3d8 = limit2;
LAB_0011eae8:
        score = local_3d8;
        if ((ulong)(long)backward_references[*back_refs_position].copy_len < local_3d8) {
          score = (size_t)backward_references[*back_refs_position].copy_len;
        }
        iVar11 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar11 == 0; iVar11 = iVar11 + -1) {
          }
        }
        sr.distance = (score * 0x87 + 0x780) - (ulong)(uint)(iVar11 * 0x1e);
        sStack_1050 = score;
        sr.len = uVar21;
      }
      if (sr.score._4_4_ == 0) goto LAB_0011f728;
    }
    if (0x7e4 < sr.distance) {
      cost_diff_lazy._4_4_ = 0;
      puVar29 = ringbuffer_local;
      if (sr.score._4_4_ == 0) {
        do {
          max_distance = max_distance - 1;
          if (params->quality < 5) {
            local_10e0 = sStack_1050 - 1;
            if (max_distance <= local_10e0) {
              local_10e0 = max_distance;
            }
            local_10e8 = local_10e0;
          }
          else {
            local_10e8 = 0;
          }
          sr2.len = 0;
          sr2.distance = 0x7e4;
          sr2.score._4_4_ = 0;
          local_10f0 = puVar13;
          if (ringbuffer_local + 1 < puVar13) {
            local_10f0 = ringbuffer_local + 1;
          }
          local_10f8 = puVar13;
          if (ringbuffer_local + sVar4 + 1 < puVar13) {
            local_10f8 = ringbuffer_local + sVar4 + 1;
          }
          pBVar36 = &params->dictionary;
          puVar35 = ringbuffer_local + 1;
          puVar29 = (uint8_t *)(params->dist).max_distance;
          puVar16 = AddrH42((hasher->privat)._H42.extra);
          puVar17 = HeadH42((hasher->privat)._H42.extra);
          puVar18 = TinyHashH42((hasher->privat)._H42.extra);
          pBVar19 = BanksH42((hasher->privat)._H42.extra);
          uVar20 = (ulong)puVar35 & ringbuffer_mask;
          best_len_1 = 0x7e4;
          i_2 = local_10e8;
          uVar7 = (uint)(*(int *)(ringbuffer + uVar20) * 0x1e35a7bd) >> 0x11;
          uVar21 = (ulong)uVar7;
          distance_code = 0;
          sr2.score._0_4_ = 0;
          while( true ) {
            bVar37 = false;
            if (*back_refs_position < back_refs_size) {
              bVar37 = (uint8_t *)(long)backward_references[*back_refs_position].position < puVar35;
            }
            if (!bVar37) break;
            *back_refs_position = *back_refs_position + 1;
          }
          if (((back_refs_size == 0) || (back_refs_size <= *back_refs_position)) ||
             ((uint8_t *)(long)backward_references[*back_refs_position].position != puVar35)) {
            for (key_3 = 0; key_3 < 0x10; key_3 = key_3 + 1) {
              puVar24 = (uint8_t *)(long)dist_cache[key_3];
              puVar25 = puVar35 + -(long)puVar24;
              if (((key_3 == 0) || (puVar18[(ulong)puVar25 & 0xffff] == (uint8_t)uVar7)) &&
                 ((puVar25 < puVar35 && (puVar24 <= local_10f0)))) {
                uVar22 = ringbuffer_mask & (ulong)puVar25;
                local_b60 = (ulong *)(ringbuffer + uVar20);
                limit2_5 = 0;
                x_5 = (max_distance >> 3) + 1;
LAB_00120aa6:
                x_5 = x_5 - 1;
                if (x_5 != 0) {
                  if (*local_b60 == *(ulong *)(ringbuffer + limit2_5 + uVar22)) goto LAB_00120b08;
                  iVar11 = 0;
                  for (uVar22 = *local_b60 ^ *(ulong *)(ringbuffer + limit2_5 + uVar22);
                      (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                    iVar11 = iVar11 + 1;
                  }
                  local_b50 = ((ulong)(long)iVar11 >> 3) + limit2_5;
                  goto LAB_00120c49;
                }
                matched_5 = (max_distance & 7) + 1;
                while (matched_5 = matched_5 - 1, matched_5 != 0) {
                  if (ringbuffer[limit2_5 + uVar22] != (uint8_t)*local_b60) {
                    local_b50 = limit2_5;
                    goto LAB_00120c49;
                  }
                  local_b60 = (ulong *)((long)local_b60 + 1);
                  limit2_5 = limit2_5 + 1;
                }
                local_b50 = limit2_5;
LAB_00120c49:
                score_6 = local_b50;
                if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
                   ((uint8_t *)(long)backward_references[*back_refs_position].position <
                    puVar35 + local_b50)) {
                  score_6 = (long)backward_references[*back_refs_position].position - (long)puVar35;
                }
                if ((1 < score_6) && (bank_2 = score_6 * 0x87 + 0x78f, best_len_1 < bank_2)) {
                  if (key_3 != 0) {
                    bank_2 = bank_2 - ((long)(int)(0x1ca10 >> ((byte)key_3 & 0xe) & 0xe) + 0x27);
                  }
                  if (best_len_1 < bank_2) {
                    best_len_1 = bank_2;
                    i_2 = score_6;
                    distance_code = score_6;
                    sr2.distance = bank_2;
                    sr2.len = (size_t)puVar24;
                  }
                }
              }
            }
            hops_1 = 0;
            slot_1 = (long)puVar35 - (ulong)puVar16[uVar21];
            prev_ix_5 = (ulong)puVar17[uVar21];
            delta_2 = (hasher->privat)._H42.max_hops;
            while ((sVar33 = delta_2 - 1, delta_2 != 0 &&
                   (hops_1 = slot_1 + hops_1, hops_1 <= local_10f0))) {
              uVar22 = (long)puVar35 - hops_1 & ringbuffer_mask;
              uVar23 = (ulong)pBVar19[uVar21 & 0x1ff].slots[prev_ix_5].next;
              slot_1 = (size_t)pBVar19[uVar21 & 0x1ff].slots[prev_ix_5].delta;
              prev_ix_5 = uVar23;
              delta_2 = sVar33;
              if ((uVar20 + i_2 <= ringbuffer_mask) &&
                 ((uVar22 + i_2 <= ringbuffer_mask &&
                  (ringbuffer[uVar20 + i_2] == ringbuffer[uVar22 + i_2])))) {
                local_ba0 = (ulong *)(ringbuffer + uVar20);
                limit2_6 = 0;
                x_6 = (max_distance >> 3) + 1;
LAB_00120fcf:
                x_6 = x_6 - 1;
                if (x_6 != 0) {
                  if (*local_ba0 == *(ulong *)(ringbuffer + limit2_6 + uVar22)) goto LAB_00121031;
                  iVar11 = 0;
                  for (uVar22 = *local_ba0 ^ *(ulong *)(ringbuffer + limit2_6 + uVar22);
                      (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                    iVar11 = iVar11 + 1;
                  }
                  local_b90 = ((ulong)(long)iVar11 >> 3) + limit2_6;
                  goto LAB_00121172;
                }
                matched_6 = (max_distance & 7) + 1;
                while (matched_6 = matched_6 - 1, matched_6 != 0) {
                  if (ringbuffer[limit2_6 + uVar22] != (uint8_t)*local_ba0) {
                    local_b90 = limit2_6;
                    goto LAB_00121172;
                  }
                  local_ba0 = (ulong *)((long)local_ba0 + 1);
                  limit2_6 = limit2_6 + 1;
                }
                local_b90 = limit2_6;
LAB_00121172:
                score_7 = local_b90;
                if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
                   ((uint8_t *)(long)backward_references[*back_refs_position].position <
                    puVar35 + local_b90)) {
                  score_7 = (long)backward_references[*back_refs_position].position - (long)puVar35;
                }
                if (3 < score_7) {
                  iVar11 = 0x1f;
                  if ((uint)hops_1 != 0) {
                    for (; (uint)hops_1 >> iVar11 == 0; iVar11 = iVar11 + -1) {
                    }
                  }
                  uVar22 = (score_7 * 0x87 + 0x780) - (ulong)(uint)(iVar11 * 0x1e);
                  if (best_len_1 < uVar22) {
                    i_2 = score_7;
                    distance_code = score_7;
                    sr2.len = hops_1;
                    sr2.distance = uVar22;
                    best_len_1 = uVar22;
                  }
                }
              }
            }
            puVar16 = AddrH42((hasher->privat)._H42.extra);
            puVar17 = HeadH42((hasher->privat)._H42.extra);
            puVar18 = TinyHashH42((hasher->privat)._H42.extra);
            pBVar19 = BanksH42((hasher->privat)._H42.extra);
            uVar7 = (uint)(*(int *)(ringbuffer + ((ulong)puVar35 & ringbuffer_mask)) * 0x1e35a7bd)
                    >> 0x11;
            uVar21 = (ulong)uVar7;
            uVar22 = uVar21 & 0x1ff;
            uVar2 = *(ushort *)((long)&hasher->privat + uVar22 * 2);
            *(ushort *)((long)&hasher->privat + uVar22 * 2) = uVar2 + 1;
            uVar12 = uVar2 & 0x1ff;
            local_1f0 = (long)puVar35 - (ulong)puVar16[uVar21];
            puVar18[(ulong)puVar35 & 0xffff] = (uint8_t)uVar7;
            if (0xffff < local_1f0) {
              local_1f0 = 0xffff;
            }
            pBVar19[uVar22].slots[(int)uVar12].delta = (uint16_t)local_1f0;
            pBVar19[uVar22].slots[(int)uVar12].next = puVar17[uVar21];
            puVar16[uVar21] = (uint32_t)puVar35;
            puVar17[uVar21] = (uint16_t)uVar12;
LAB_001214e2:
            if (sr2.distance == 0x7e4) {
              if (back_refs_size == 0) {
                pHVar5 = (hasher->privat)._H42.common;
                piVar34 = (int *)(ringbuffer + uVar20);
                if (pHVar5->dict_num_lookups >> 7 <= pHVar5->dict_num_matches) {
                  i_3 = (size_t)(((uint)(*piVar34 * 0x1e35a7bd) >> 0x12) << 1);
                  for (uStack_b28 = 0; uStack_b28 < 2; uStack_b28 = uStack_b28 + 1) {
                    pHVar5->dict_num_lookups = pHVar5->dict_num_lookups + 1;
                    if ((params->dictionary).hash_table_lengths[i_3] != '\0') {
                      bVar1 = (params->dictionary).hash_table_lengths[i_3];
                      uVar21 = (ulong)bVar1;
                      uVar20 = (ulong)(params->dictionary).hash_table_words[i_3];
                      if (max_distance < uVar21) {
                        bVar37 = false;
                      }
                      else {
                        local_9e0 = (ulong *)(pBVar36->words->data +
                                             (ulong)pBVar36->words->offsets_by_length[uVar21] +
                                             uVar21 * uVar20);
                        limit2_7 = 0;
                        x_7 = (ulong)(bVar1 >> 3) + 1;
LAB_0012178b:
                        x_7 = x_7 - 1;
                        if (x_7 != 0) {
                          if (*local_9e0 == *(ulong *)((long)piVar34 + limit2_7)) goto LAB_001217ed;
                          iVar11 = 0;
                          for (uVar22 = *local_9e0 ^ *(ulong *)((long)piVar34 + limit2_7);
                              (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                            iVar11 = iVar11 + 1;
                          }
                          local_9d0 = ((ulong)(long)iVar11 >> 3) + limit2_7;
                          goto LAB_0012192e;
                        }
                        matched_7 = (uVar21 & 7) + 1;
                        while (matched_7 = matched_7 - 1, matched_7 != 0) {
                          if (*(char *)((long)piVar34 + limit2_7) != (char)*local_9e0) {
                            local_9d0 = limit2_7;
                            goto LAB_0012192e;
                          }
                          local_9e0 = (ulong *)((long)local_9e0 + 1);
                          limit2_7 = limit2_7 + 1;
                        }
                        local_9d0 = limit2_7;
LAB_0012192e:
                        if ((uVar21 < local_9d0 + (params->dictionary).cutoffTransformsCount) &&
                           (local_9d0 != 0)) {
                          puVar18 = local_10f8 +
                                    ((uVar21 - local_9d0) * 4 +
                                     ((params->dictionary).cutoffTransforms >>
                                      ((char)(uVar21 - local_9d0) * '\x06' & 0x3fU) & 0x3f) <<
                                    (pBVar36->words->size_bits_by_length[uVar21] & 0x3f)) +
                                    uVar20 + 1;
                          if (puVar29 < puVar18) {
                            bVar37 = false;
                          }
                          else {
                            iVar11 = 0x1f;
                            if ((uint)puVar18 != 0) {
                              for (; (uint)puVar18 >> iVar11 == 0; iVar11 = iVar11 + -1) {
                              }
                            }
                            uVar20 = (local_9d0 * 0x87 + 0x780) - (ulong)(uint)(iVar11 * 0x1e);
                            if (uVar20 < sr2.distance) {
                              bVar37 = false;
                            }
                            else {
                              distance_code = local_9d0;
                              sr2.score._0_4_ = (uint)bVar1 - (int)local_9d0;
                              bVar37 = true;
                              sr2.len = (size_t)puVar18;
                              sr2.distance = uVar20;
                            }
                          }
                        }
                        else {
                          bVar37 = false;
                        }
                      }
                      if (bVar37) {
                        pHVar5->dict_num_matches = pHVar5->dict_num_matches + 1;
                      }
                    }
                    i_3 = i_3 + 1;
                  }
                }
              }
              else if (((*back_refs_position < back_refs_size) &&
                       ((uint8_t *)(long)backward_references[*back_refs_position].position ==
                        puVar35)) &&
                      (backward_references[*back_refs_position].max_distance <
                       backward_references[*back_refs_position].distance)) {
                uVar7 = backward_references[*back_refs_position].distance;
                iVar11 = backward_references[*back_refs_position].copy_len;
                if ((((int)uVar7 < 0x7ffffffd) && (3 < iVar11)) && (iVar11 < 0x19)) {
                  uVar8 = (uVar7 - (int)local_10f0) - 1;
                  uVar12 = pBVar36->words->offsets_by_length[iVar11];
                  bVar1 = pBVar36->words->size_bits_by_length[iVar11];
                  uVar3 = kBitMask[bVar1];
                  iVar9 = (int)uVar8 >> (bVar1 & 0x1f);
                  if (iVar9 < (int)(params->dictionary).num_transforms) {
                    puVar29 = pBVar36->words->data;
                    uVar26 = BrotliGetTransforms();
                    pvVar27 = malloc((long)iVar11 * 10);
                    iVar9 = BrotliTransformDictionaryWord
                                      (pvVar27,puVar29 + (long)(int)((uVar8 & uVar3) * iVar11) +
                                                         (ulong)uVar12,iVar11,uVar26,iVar9);
                    sVar28 = (size_t)iVar9;
                    iVar10 = memcmp(ringbuffer + uVar20,pvVar27,sVar28);
                    if (iVar10 == 0) {
                      iVar10 = 0x1f;
                      if (uVar7 != 0) {
                        for (; uVar7 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                        }
                      }
                      sr2.distance = (sVar28 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
                      sr2.score._0_4_ = iVar11 - iVar9;
                      sr2.len = (size_t)(int)uVar7;
                      distance_code = sVar28;
                    }
                  }
                }
                sr2.score._4_4_ = 1;
              }
            }
          }
          else {
            uVar7 = backward_references[*back_refs_position].distance;
            uVar21 = (ulong)(int)uVar7;
            if ((puVar35 + -uVar21 < puVar35) &&
               (uVar21 <= (ulong)(long)backward_references[*back_refs_position].max_distance)) {
              uVar22 = ringbuffer_mask & (ulong)(puVar35 + -uVar21);
              local_8f8 = (ulong *)(ringbuffer + uVar20);
              limit2_4 = 0;
              x_4 = (max_distance >> 3) + 1;
LAB_001206ed:
              x_4 = x_4 - 1;
              if (x_4 != 0) {
                if (*local_8f8 == *(ulong *)(ringbuffer + limit2_4 + uVar22)) goto LAB_0012074f;
                iVar11 = 0;
                for (uVar22 = *local_8f8 ^ *(ulong *)(ringbuffer + limit2_4 + uVar22);
                    (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                  iVar11 = iVar11 + 1;
                }
                local_8e8 = ((ulong)(long)iVar11 >> 3) + limit2_4;
                goto LAB_00120890;
              }
              matched_4 = (max_distance & 7) + 1;
              while (matched_4 = matched_4 - 1, matched_4 != 0) {
                if (ringbuffer[limit2_4 + uVar22] != (uint8_t)*local_8f8) {
                  local_8e8 = limit2_4;
                  goto LAB_00120890;
                }
                local_8f8 = (ulong *)((long)local_8f8 + 1);
                limit2_4 = limit2_4 + 1;
              }
              local_8e8 = limit2_4;
LAB_00120890:
              score_5 = local_8e8;
              if ((ulong)(long)backward_references[*back_refs_position].copy_len < local_8e8) {
                score_5 = (size_t)backward_references[*back_refs_position].copy_len;
              }
              iVar11 = 0x1f;
              if (uVar7 != 0) {
                for (; uVar7 >> iVar11 == 0; iVar11 = iVar11 + -1) {
                }
              }
              sr2.distance = (score_5 * 0x87 + 0x780) - (ulong)(uint)(iVar11 * 0x1e);
              distance_code = score_5;
              sr2.score._4_4_ = 1;
              sr2.len = uVar21;
            }
            if (sr2.score._4_4_ == 0) goto LAB_001214e2;
          }
          if ((sr2.distance < sr.distance + 0xaf) &&
             (puVar29 = ringbuffer_local, sr2.score._4_4_ == 0)) break;
          puVar29 = ringbuffer_local + 1;
          pos_end = pos_end + 1;
          sStack_1050 = distance_code;
          sr.len = sr2.len;
          sr.distance = sr2.distance;
          sr.score = CONCAT44(sr2.score._4_4_,(int)sr2.score);
          if ((sr2.score._4_4_ != 0) ||
             ((cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1, 3 < cost_diff_lazy._4_4_ ||
              (puVar18 = ringbuffer_local + 5, ringbuffer_local = puVar29, puVar14 <= puVar18))))
          break;
        } while( true );
      }
      ringbuffer_local = puVar29;
      gap = (size_t)(ringbuffer_local + lVar15 + sStack_1050 * 2);
      local_1108 = puVar13;
      if (ringbuffer_local + sVar4 < puVar13) {
        local_1108 = ringbuffer_local + sVar4;
      }
      if (local_1108 < sr.len) {
LAB_001221e3:
        local_eb8 = sr.len + 0xf;
      }
      else {
        uVar20 = (sr.len + 3) - (long)*dist_cache;
        uVar21 = (sr.len + 3) - (long)dist_cache[1];
        if (sr.len == (long)*dist_cache) {
          local_eb8 = 0;
        }
        else if (sr.len == (long)dist_cache[1]) {
          local_eb8 = 1;
        }
        else if (uVar20 < 7) {
          local_eb8 = (ulong)(int)(0x9750468 >> ((byte)((uVar20 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (uVar21 < 7) {
          local_eb8 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar21 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (sr.len == (long)dist_cache[2]) {
          local_eb8 = 2;
        }
        else {
          if (sr.len != (long)dist_cache[3]) goto LAB_001221e3;
          local_eb8 = 3;
        }
      }
      if ((sr.len <= local_1108) && (local_eb8 != 0)) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = *dist_cache;
        *dist_cache = (int)sr.len;
        iVar11 = *dist_cache;
        dist_cache[4] = iVar11 + -1;
        dist_cache[5] = iVar11 + 1;
        dist_cache[6] = iVar11 + -2;
        dist_cache[7] = iVar11 + 2;
        dist_cache[8] = iVar11 + -3;
        dist_cache[9] = iVar11 + 3;
        iVar11 = dist_cache[1];
        dist_cache[10] = iVar11 + -1;
        dist_cache[0xb] = iVar11 + 1;
        dist_cache[0xc] = iVar11 + -2;
        dist_cache[0xd] = iVar11 + 2;
        dist_cache[0xe] = iVar11 + -3;
        dist_cache[0xf] = iVar11 + 3;
      }
      uVar32 = (uint32_t)pos_end;
      commands->insert_len_ = uVar32;
      commands->copy_len_ = (uint)sStack_1050 | (int)sr.score << 0x19;
      uVar7 = (params->dist).num_direct_distance_codes;
      uVar12 = (params->dist).distance_postfix_bits;
      if (local_eb8 < (ulong)uVar7 + 0x10) {
        commands->dist_prefix_ = (uint16_t)local_eb8;
        commands->dist_extra_ = 0;
      }
      else {
        bVar1 = (byte)uVar12;
        uVar20 = (1L << (bVar1 + 2 & 0x3f)) + ((local_eb8 - 0x10) - (ulong)uVar7);
        iVar11 = 0x1f;
        if ((uint)uVar20 != 0) {
          for (; (uint)uVar20 >> iVar11 == 0; iVar11 = iVar11 + -1) {
          }
        }
        bVar31 = (byte)(iVar11 - 1U);
        uVar21 = uVar20 >> (bVar31 & 0x3f) & 1;
        lVar30 = (ulong)(iVar11 - 1U) - (ulong)uVar12;
        commands->dist_prefix_ =
             (short)lVar30 * 0x400 |
             (short)uVar7 + 0x10 + (short)((lVar30 + -1) * 2 + uVar21 << (bVar1 & 0x3f)) +
             ((ushort)uVar20 & (short)(1 << (bVar1 & 0x1f)) - 1U);
        commands->dist_extra_ =
             (uint32_t)(uVar20 - (uVar21 + 2 << (bVar31 & 0x3f)) >> (bVar1 & 0x3f));
      }
      iVar11 = (uint)sStack_1050 + (int)sr.score;
      uVar20 = (ulong)iVar11;
      if (pos_end < 6) {
        local_da2 = (ushort)pos_end;
      }
      else if (pos_end < 0x82) {
        iVar9 = 0x1f;
        if (uVar32 - 2 != 0) {
          for (; uVar32 - 2 >> iVar9 == 0; iVar9 = iVar9 + -1) {
          }
        }
        local_da2 = (short)(iVar9 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar9 + -1) & 0x3f)) +
                    2;
      }
      else if (pos_end < 0x842) {
        iVar9 = 0x1f;
        if (uVar32 - 0x42 != 0) {
          for (; uVar32 - 0x42 >> iVar9 == 0; iVar9 = iVar9 + -1) {
          }
        }
        local_da2 = (short)iVar9 + 10;
      }
      else if (pos_end < 0x1842) {
        local_da2 = 0x15;
      }
      else if (pos_end < 0x5842) {
        local_da2 = 0x16;
      }
      else {
        local_da2 = 0x17;
      }
      if (uVar20 < 10) {
        local_d7a = (short)iVar11 - 2;
      }
      else if (uVar20 < 0x86) {
        iVar9 = 0x1f;
        if (iVar11 - 6U != 0) {
          for (; iVar11 - 6U >> iVar9 == 0; iVar9 = iVar9 + -1) {
          }
        }
        local_d7a = (short)(iVar9 + -1) * 2 + (short)(uVar20 - 6 >> ((byte)(iVar9 + -1) & 0x3f)) + 4
        ;
      }
      else if (uVar20 < 0x846) {
        iVar9 = 0x1f;
        if (iVar11 - 0x46U != 0) {
          for (; iVar11 - 0x46U >> iVar9 == 0; iVar9 = iVar9 + -1) {
          }
        }
        local_d7a = (short)iVar9 + 0xc;
      }
      else {
        local_d7a = 0x17;
      }
      local_d52 = local_d7a & 7 | (local_da2 & 7) << 3;
      if ((((commands->dist_prefix_ & 0x3ff) == 0) && (local_da2 < 8)) && (local_d7a < 0x10)) {
        if (7 < local_d7a) {
          local_d52 = local_d52 | 0x40;
        }
      }
      else {
        iVar11 = ((int)(uint)local_d7a >> 3) + ((int)(uint)local_da2 >> 3) * 3;
        local_d52 = (short)iVar11 * 0x40 + 0x40 +
                    ((ushort)(0x520d40 >> ((char)iVar11 * '\x02' & 0x1fU)) & 0xc0) | local_d52;
      }
      commands->cmd_prefix_ = local_d52;
      *num_literals = pos_end + *num_literals;
      pos_end = 0;
      range_end = (size_t)(ringbuffer_local + 2);
      local_1120 = ringbuffer_local + sStack_1050;
      if (local_10c0 <= local_1120) {
        local_1120 = local_10c0;
      }
      if (sr.len < sStack_1050 >> 2) {
        local_1130 = ringbuffer_local + sr.len * -4 + sStack_1050;
        if (local_1130 < range_end) {
          local_1130 = (uint8_t *)range_end;
        }
        if (local_1120 < local_1130) {
          local_1138 = local_1120;
        }
        else {
          local_1138 = local_1130;
        }
        range_end = (size_t)local_1138;
      }
      for (local_2e0 = (uint8_t *)range_end; local_2e0 < local_1120; local_2e0 = local_2e0 + 1) {
        puVar16 = AddrH42((hasher->privat)._H42.extra);
        puVar17 = HeadH42((hasher->privat)._H42.extra);
        puVar29 = TinyHashH42((hasher->privat)._H42.extra);
        pBVar19 = BanksH42((hasher->privat)._H42.extra);
        uVar7 = (uint)(*(int *)(ringbuffer + ((ulong)local_2e0 & ringbuffer_mask)) * 0x1e35a7bd) >>
                0x11;
        uVar20 = (ulong)uVar7;
        uVar21 = uVar20 & 0x1ff;
        uVar2 = *(ushort *)((long)&hasher->privat + uVar21 * 2);
        *(ushort *)((long)&hasher->privat + uVar21 * 2) = uVar2 + 1;
        uVar12 = uVar2 & 0x1ff;
        local_2b0 = (long)local_2e0 - (ulong)puVar16[uVar20];
        puVar29[(ulong)local_2e0 & 0xffff] = (uint8_t)uVar7;
        if (0xffff < local_2b0) {
          local_2b0 = 0xffff;
        }
        pBVar19[uVar21].slots[(int)uVar12].delta = (uint16_t)local_2b0;
        pBVar19[uVar21].slots[(int)uVar12].next = puVar17[uVar20];
        puVar16[uVar20] = (uint32_t)local_2e0;
        puVar17[uVar20] = (uint16_t)uVar12;
      }
      commands = commands + 1;
      puVar29 = ringbuffer_local + sStack_1050;
      goto LAB_0011e441;
    }
    pos_end = pos_end + 1;
    puVar29 = ringbuffer_local + 1;
    if ((gap < puVar29) && (back_refs_size == 0)) {
      if ((uint8_t *)(gap + lVar15 * 4) < puVar29) {
        puVar18 = ringbuffer_local + 0x11;
        local_1148 = puVar14 + -4;
        ringbuffer_local = puVar29;
        if (puVar18 < local_1148) {
          local_1148 = puVar18;
        }
        for (; puVar29 = ringbuffer_local, ringbuffer_local < local_1148;
            ringbuffer_local = ringbuffer_local + 4) {
          puVar16 = AddrH42((hasher->privat)._H42.extra);
          puVar17 = HeadH42((hasher->privat)._H42.extra);
          puVar29 = TinyHashH42((hasher->privat)._H42.extra);
          pBVar19 = BanksH42((hasher->privat)._H42.extra);
          uVar7 = (uint)(*(int *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask)) *
                        0x1e35a7bd) >> 0x11;
          uVar20 = (ulong)uVar7;
          uVar21 = uVar20 & 0x1ff;
          uVar2 = *(ushort *)((long)&hasher->privat + uVar21 * 2);
          *(ushort *)((long)&hasher->privat + uVar21 * 2) = uVar2 + 1;
          uVar12 = uVar2 & 0x1ff;
          local_130 = (long)ringbuffer_local - (ulong)puVar16[uVar20];
          puVar29[(ulong)ringbuffer_local & 0xffff] = (uint8_t)uVar7;
          if (0xffff < local_130) {
            local_130 = 0xffff;
          }
          pBVar19[uVar21].slots[(int)uVar12].delta = (uint16_t)local_130;
          pBVar19[uVar21].slots[(int)uVar12].next = puVar17[uVar20];
          puVar16[uVar20] = (uint32_t)ringbuffer_local;
          puVar17[uVar20] = (uint16_t)uVar12;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar18 = ringbuffer_local + 9;
        local_1158 = puVar14 + -3;
        ringbuffer_local = puVar29;
        if (puVar18 < local_1158) {
          local_1158 = puVar18;
        }
        for (; puVar29 = ringbuffer_local, ringbuffer_local < local_1158;
            ringbuffer_local = ringbuffer_local + 2) {
          puVar16 = AddrH42((hasher->privat)._H42.extra);
          puVar17 = HeadH42((hasher->privat)._H42.extra);
          puVar29 = TinyHashH42((hasher->privat)._H42.extra);
          pBVar19 = BanksH42((hasher->privat)._H42.extra);
          uVar7 = (uint)(*(int *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask)) *
                        0x1e35a7bd) >> 0x11;
          uVar20 = (ulong)uVar7;
          uVar21 = uVar20 & 0x1ff;
          uVar2 = *(ushort *)((long)&hasher->privat + uVar21 * 2);
          *(ushort *)((long)&hasher->privat + uVar21 * 2) = uVar2 + 1;
          uVar12 = uVar2 & 0x1ff;
          local_190 = (long)ringbuffer_local - (ulong)puVar16[uVar20];
          puVar29[(ulong)ringbuffer_local & 0xffff] = (uint8_t)uVar7;
          if (0xffff < local_190) {
            local_190 = 0xffff;
          }
          pBVar19[uVar21].slots[(int)uVar12].delta = (uint16_t)local_190;
          pBVar19[uVar21].slots[(int)uVar12].next = puVar17[uVar20];
          puVar16[uVar20] = (uint32_t)ringbuffer_local;
          puVar17[uVar20] = (uint16_t)uVar12;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
LAB_0011ed60:
  local_650 = local_650 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_0011ecfe;
LAB_0011f289:
  local_690 = local_690 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_0011f227;
LAB_0011e9a7:
  local_3e8 = local_3e8 + 1;
  limit2 = limit2 + 8;
  goto LAB_0011e945;
LAB_0011fa33:
  local_4d0 = local_4d0 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_0011f9d1;
LAB_00120b08:
  local_b60 = local_b60 + 1;
  limit2_5 = limit2_5 + 8;
  goto LAB_00120aa6;
LAB_00121031:
  local_ba0 = local_ba0 + 1;
  limit2_6 = limit2_6 + 8;
  goto LAB_00120fcf;
LAB_0012074f:
  local_8f8 = local_8f8 + 1;
  limit2_4 = limit2_4 + 8;
  goto LAB_001206ed;
LAB_001217ed:
  local_9e0 = local_9e0 + 1;
  limit2_7 = limit2_7 + 8;
  goto LAB_0012178b;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}